

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::recalc_share_mode(torrent *this)

{
  pointer pppVar1;
  peer_connection *this_00;
  long *plVar2;
  undefined1 auVar3 [16];
  pointer __first;
  pointer __last;
  bool bVar4;
  int iVar5;
  int iVar6;
  mt19937 *__g;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar7;
  long lVar8;
  piece_index_t index;
  undefined8 in_RSI;
  ulong uVar9;
  int iVar10;
  pointer pppVar11;
  piece_stats_t pVar12;
  vector<peer_connection_*> seeds;
  int local_80;
  int local_7c;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  local_78;
  uint local_54;
  undefined1 local_50 [8];
  undefined1 local_48;
  undefined7 uStack_47;
  torrent *local_38;
  
  bVar4 = is_seed(this);
  if (!bVar4) {
    pppVar11 = (this->super_torrent_hot_members).m_connections.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pppVar1 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar11 == pppVar1) {
      local_7c = 0;
      uVar9 = 0;
      iVar7 = 0;
      iVar10 = 0;
    }
    else {
      local_54 = (((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->m_files).m_num_pieces;
      iVar10 = 0;
      iVar7 = 0;
      local_80 = 0;
      local_7c = 0;
      do {
        this_00 = *pppVar11;
        if ((((this_00->super_peer_connection_hot_members).field_0x28 & 2) == 0) &&
           (iVar5 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this_00),
           (char)iVar5 == '\0')) {
          iVar7 = iVar7 + 1;
          bVar4 = peer_connection::is_seed(this_00);
          if (bVar4) {
            iVar10 = iVar10 + 1;
          }
          else if ((((this_00->field_0x886 & 6) == 0) &&
                   (bVar4 = peer_connection::is_seed(this_00), !bVar4)) &&
                  ((this_00->field_0x887 & 1) == 0)) {
            local_80 = local_80 + 1;
            local_7c = (local_7c + local_54) - this_00->m_num_pieces;
          }
        }
        pppVar11 = pppVar11 + 1;
      } while (pppVar11 != pppVar1);
      uVar9 = CONCAT71((int7)((ulong)in_RSI >> 8),local_80 != 0);
    }
    if (iVar7 != 0) {
      if ((0x32 < (iVar10 * 100) / iVar7) &&
         (0x5a < (iVar7 * 100) /
                 (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                             0x21) & 0xffffff) || 0x14 < iVar7)) {
        local_54 = (uint)uVar9;
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (peer_connection **)0x0;
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (peer_connection **)0x0;
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::reserve(&local_78,(long)iVar10);
        pppVar1 = (this->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pppVar11 = (this->super_torrent_hot_members).m_connections.
                        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        .
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            __last = local_78.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            __first = local_78.
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start, pppVar11 != pppVar1;
            pppVar11 = pppVar11 + 1) {
          bVar4 = peer_connection::is_seed(*pppVar11);
          if (bVar4) {
            if (local_78.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_78.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
              ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                        ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                          *)&local_78,
                         (iterator)
                         local_78.
                         super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,pppVar11);
            }
            else {
              *local_78.
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_finish = *pppVar11;
              local_78.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_78.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        __g = random_engine();
        ::std::
        shuffle<libtorrent::aux::peer_connection**,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                  (__first,__last,__g);
        pppVar11 = local_78.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        iVar5 = iVar10 - iVar7 / 2;
        local_38 = this;
        if (iVar5 != 0) {
          lVar8 = 0;
          do {
            plVar2 = *(long **)((long)&((__mutex_base *)pppVar11)->_M_mutex + lVar8);
            _local_50 = errors::make_error_code(upload_upload_connection);
            (**(code **)(*plVar2 + 0xa0))(plVar2,local_50,1,0);
            lVar8 = lVar8 + 8;
          } while ((long)iVar5 * 8 != lVar8);
        }
        if ((mutex_type *)
            local_78.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (mutex_type *)0x0) {
          operator_delete(local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar9 = (ulong)local_54;
        this = local_38;
      }
      if (((byte)uVar9 & iVar10 * 2 < local_7c) == 1) {
        piece_picker::have((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl);
        piece_picker::want((piece_count *)local_50,
                           (this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl);
        iVar10 = local_50._0_4_;
        if ((int)local_50._0_4_ <
            (int)local_78.
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
          iVar10 = (int)local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar5 = (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_piece_length;
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)(CONCAT44(extraout_var,iVar6) + 0x438);
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)local_78.
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78);
        local_78.
        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT71(local_78.
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
        lVar8 = (long)*(int *)(CONCAT44(extraout_var,iVar6) + 0x2dc) * (long)iVar5 * (long)iVar10;
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
        if (((lVar8 - this->m_total_uploaded == 0 || lVar8 < this->m_total_uploaded) || iVar10 < 1)
           && (iVar5 = piece_picker::get_download_queue_size
                                 ((this->super_torrent_hot_members).m_picker._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                  _M_head_impl), iVar5 <= iVar10 / 0x14)) {
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar10 = (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces;
          auVar3._12_4_ = 0;
          auVar3._0_12_ = stack0xffffffffffffffb4;
          _local_50 = (error_code)(auVar3 << 0x20);
          if (iVar10 < 1) {
            iVar5 = 0x7fffffff;
          }
          else {
            index.m_val = 0;
            iVar5 = 0x7fffffff;
            do {
              pVar12 = piece_picker::piece_stats
                                 ((this->super_torrent_hot_members).m_picker._M_t.
                                  super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                  .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                  _M_head_impl,index);
              iVar6 = pVar12.peer_count;
              if (iVar6 != 0) {
                if ((pVar12._0_8_ >> 0x20 == 0) &&
                   (((pVar12._8_4_ >> 8 & 1) == 0 & (pVar12.have ^ 1U)) == 0)) {
                  piece_picker::set_piece_priority
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,(piece_index_t)local_50._0_4_,(download_priority_t)0x4);
                }
                else if ((iVar6 <= iVar5 &&
                         ((undefined1  [12])pVar12 & (undefined1  [12])0x1) == (undefined1  [12])0x0
                         ) && pVar12.priority < 1) {
                  if (iVar5 == iVar6) {
                    if (local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      ::std::
                      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                      ::
                      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                  *)&local_78,
                                 (iterator)
                                 local_78.
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 local_50);
                    }
                    else {
                      *(int *)local_78.
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish = local_50._0_4_;
                      iVar6 = iVar5;
LAB_0032752c:
                      local_78.
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)((long)local_78.
                                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4);
                      iVar5 = iVar6;
                    }
                  }
                  else {
                    if (local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                      local_78.
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           local_78.
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    }
                    if (local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish !=
                        local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *(int *)local_78.
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish = local_50._0_4_;
                      goto LAB_0032752c;
                    }
                    ::std::
                    vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                    ::
                    _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                              ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                *)&local_78,
                               (iterator)
                               local_78.
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                               local_50);
                    iVar5 = iVar6;
                  }
                }
              }
              index.m_val = local_50._0_4_ + 1;
              local_50._0_4_ = index.m_val;
            } while (index.m_val < iVar10);
          }
          update_gauge(this);
          update_want_peers(this);
          iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x2e])();
          local_48 = false;
          local_50 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar10) + 0x438);
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
          local_48 = true;
          iVar10 = *(int *)(CONCAT44(extraout_var_00,iVar10) + 0x2dc);
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
          if (iVar10 <= iVar7 - iVar5) {
            lVar8 = random((aux *)(ulong)((int)((ulong)((long)local_78.
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_78.
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) -
                                         1));
            bVar4 = is_finished(this);
            piece_picker::set_piece_priority
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       (piece_index_t)
                       *(int *)((long)&((__mutex_base *)
                                       local_78.
                                       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_mutex +
                               (long)(int)lVar8 * 4),(download_priority_t)0x4);
            update_gauge(this);
            update_peer_interest(this,bVar4);
            update_want_peers(this);
          }
          if ((mutex_type *)
              local_78.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (mutex_type *)0x0) {
            operator_delete(local_78.
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::recalc_share_mode()
	{
		TORRENT_ASSERT(share_mode());
		if (is_seed()) return;

		int const pieces_in_torrent = m_torrent_file->num_pieces();
		int num_seeds = 0;
		int num_peers = 0;
		int num_downloaders = 0;
		int missing_pieces = 0;
		for (auto const* const p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->is_connecting()) continue;
			if (p->is_disconnecting()) continue;
			++num_peers;
			if (p->is_seed())
			{
				++num_seeds;
				continue;
			}

			if (p->share_mode()) continue;
			if (p->upload_only()) continue;

			++num_downloaders;
			missing_pieces += pieces_in_torrent - p->num_have_pieces();
		}

		if (num_peers == 0) return;

		if (num_seeds * 100 / num_peers > 50
			&& (num_peers * 100 / m_max_connections > 90
				|| num_peers > 20))
		{
			// we are connected to more than 50% seeds (and we're beyond
			// 90% of the max number of connections). That will
			// limit our ability to upload. We need more downloaders.
			// disconnect some seeds so that we don't have more than 50%
			int const to_disconnect = num_seeds - num_peers / 2;
			aux::vector<peer_connection*> seeds;
			seeds.reserve(num_seeds);
			std::copy_if(m_connections.begin(), m_connections.end(), std::back_inserter(seeds)
				, [](peer_connection const* p) { return p->is_seed(); });

			aux::random_shuffle(seeds);
			TORRENT_ASSERT(to_disconnect <= seeds.end_index());
			for (auto const& p : span<peer_connection*>(seeds).first(to_disconnect))
				p->disconnect(errors::upload_upload_connection, operation_t::bittorrent);
		}

		if (num_downloaders == 0) return;

		// assume that the seeds are about as fast as us. During the time
		// we can download one piece, and upload one piece, each seed
		// can upload two pieces.
		missing_pieces -= 2 * num_seeds;

		if (missing_pieces <= 0) return;

		// missing_pieces represents our opportunity to download pieces
		// and share them more than once each

		// now, download at least one piece, otherwise download one more
		// piece if our downloaded (and downloading) pieces is less than 50%
		// of the uploaded bytes
		int const num_downloaded_pieces = std::max(m_picker->have().num_pieces
			, m_picker->want().num_pieces);

		if (std::int64_t(num_downloaded_pieces) * m_torrent_file->piece_length()
			* settings().get_int(settings_pack::share_mode_target) > m_total_uploaded
			&& num_downloaded_pieces > 0)
			return;

		// don't have more pieces downloading in parallel than 5% of the total
		// number of pieces we have downloaded
		if (m_picker->get_download_queue_size() > num_downloaded_pieces / 20)
			return;

		// one more important property is that there are enough pieces
		// that more than one peer wants to download
		// make sure that there are enough downloaders for the rarest
		// piece. Go through all pieces, figure out which one is the rarest
		// and how many peers that has that piece

		aux::vector<piece_index_t> rarest_pieces;

		int const num_pieces = m_torrent_file->num_pieces();
		int rarest_rarity = INT_MAX;
		for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
		{
			piece_picker::piece_stats_t ps = m_picker->piece_stats(i);
			if (ps.peer_count == 0) continue;
			if (ps.priority == 0 && (ps.have || ps.downloading))
			{
				m_picker->set_piece_priority(i, default_priority);
				continue;
			}
			// don't count pieces we already have or are trying to download
			if (ps.priority > 0 || ps.have) continue;
			if (ps.peer_count > rarest_rarity) continue;
			if (ps.peer_count == rarest_rarity)
			{
				rarest_pieces.push_back(i);
				continue;
			}

			rarest_pieces.clear();
			rarest_rarity = ps.peer_count;
			rarest_pieces.push_back(i);
		}

		update_gauge();
		update_want_peers();

		// now, rarest_pieces is a list of all pieces that are the rarest ones.
		// and rarest_rarity is the number of peers that have the rarest pieces

		// if there's only a single peer that doesn't have the rarest piece
		// it's impossible for us to download one piece and upload it
		// twice. i.e. we cannot get a positive share ratio
		if (num_peers - rarest_rarity
			< settings().get_int(settings_pack::share_mode_target))
			return;

		// now, pick one of the rarest pieces to download
		int const pick = int(random(aux::numeric_cast<std::uint32_t>(rarest_pieces.end_index() - 1)));
		bool const was_finished = is_finished();
		m_picker->set_piece_priority(rarest_pieces[pick], default_priority);
		update_gauge();
		update_peer_interest(was_finished);
		update_want_peers();
	}